

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  long lVar8;
  int iVar9;
  AABBNodeMB4D *node1;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [64];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [64];
  float fVar85;
  float fVar87;
  float fVar88;
  undefined1 auVar86 [16];
  float fVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar93;
  float fVar94;
  float fVar96;
  float fVar97;
  undefined1 auVar95 [16];
  float fVar98;
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar99 [16];
  float fVar103;
  float fVar104;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar112;
  float fVar113;
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar114 [64];
  undefined1 auVar118 [16];
  undefined1 auVar119 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_c31;
  ulong *local_c30;
  ulong *local_c28;
  undefined8 local_c20;
  float fStack_c18;
  float fStack_c14;
  undefined1 local_c10 [16];
  undefined1 local_c00 [16];
  undefined1 local_bf0 [16];
  size_t local_be0;
  RayK<8> *local_bd8;
  undefined1 local_bd0 [16];
  undefined1 local_bc0 [16];
  undefined1 local_bb0 [16];
  undefined1 local_ba0 [16];
  undefined1 local_b90 [16];
  undefined1 local_b80 [16];
  undefined1 local_b70 [16];
  ulong local_b58;
  long local_b50;
  long local_b48;
  Scene *local_b40;
  ulong local_b38;
  RTCFilterFunctionNArguments local_b30;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [16];
  undefined1 local_ad0 [16];
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  float local_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float local_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  float local_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  float local_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 *local_9c0;
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined1 local_980 [16];
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_c28 = local_7f8;
  local_800 = root.ptr;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_a40._4_4_ = uVar2;
  local_a40._0_4_ = uVar2;
  local_a40._8_4_ = uVar2;
  local_a40._12_4_ = uVar2;
  auVar71 = ZEXT1664(local_a40);
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_a50._4_4_ = uVar2;
  local_a50._0_4_ = uVar2;
  local_a50._8_4_ = uVar2;
  local_a50._12_4_ = uVar2;
  auVar79 = ZEXT1664(local_a50);
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_a60._4_4_ = uVar2;
  local_a60._0_4_ = uVar2;
  local_a60._8_4_ = uVar2;
  local_a60._12_4_ = uVar2;
  auVar84 = ZEXT1664(local_a60);
  fVar94 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar98 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar103 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar85 = fVar94 * 0.99999964;
  fVar89 = fVar98 * 0.99999964;
  fVar93 = fVar103 * 0.99999964;
  fVar94 = fVar94 * 1.0000004;
  fVar98 = fVar98 * 1.0000004;
  fVar103 = fVar103 * 1.0000004;
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_b38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar14 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar27 = uVar19 ^ 0x10;
  uVar25 = local_b38 ^ 0x10;
  iVar9 = (tray->tnear).field_0.i[k];
  local_ad0._4_4_ = iVar9;
  local_ad0._0_4_ = iVar9;
  local_ad0._8_4_ = iVar9;
  local_ad0._12_4_ = iVar9;
  auVar114 = ZEXT1664(local_ad0);
  iVar9 = (tray->tfar).field_0.i[k];
  local_ae0._4_4_ = iVar9;
  local_ae0._0_4_ = iVar9;
  local_ae0._8_4_ = iVar9;
  local_ae0._12_4_ = iVar9;
  auVar119 = ZEXT1664(local_ae0);
  iVar9 = 1 << ((uint)k & 0x1f);
  auVar35._4_4_ = iVar9;
  auVar35._0_4_ = iVar9;
  auVar35._8_4_ = iVar9;
  auVar35._12_4_ = iVar9;
  auVar35._16_4_ = iVar9;
  auVar35._20_4_ = iVar9;
  auVar35._24_4_ = iVar9;
  auVar35._28_4_ = iVar9;
  auVar7 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar35 = vpand_avx2(auVar35,auVar7);
  local_940 = vpcmpeqd_avx2(auVar35,auVar7);
  fVar87 = fVar85;
  fVar88 = fVar85;
  fVar104 = fVar85;
  fVar108 = fVar89;
  fVar110 = fVar89;
  fVar112 = fVar89;
  fVar113 = fVar93;
  fVar115 = fVar93;
  fVar116 = fVar93;
  fVar117 = fVar94;
  fVar96 = fVar94;
  fVar97 = fVar94;
  fVar100 = fVar98;
  fVar101 = fVar98;
  fVar102 = fVar98;
  fVar107 = fVar103;
  fVar109 = fVar103;
  fVar111 = fVar103;
  local_be0 = k;
  local_bd8 = ray;
  local_b58 = uVar19;
  local_ac0 = fVar103;
  fStack_abc = fVar103;
  fStack_ab8 = fVar103;
  fStack_ab4 = fVar103;
  local_ab0 = fVar98;
  fStack_aac = fVar98;
  fStack_aa8 = fVar98;
  fStack_aa4 = fVar98;
  local_aa0 = fVar94;
  fStack_a9c = fVar94;
  fStack_a98 = fVar94;
  fStack_a94 = fVar94;
  local_a90 = fVar93;
  fStack_a8c = fVar93;
  fStack_a88 = fVar93;
  fStack_a84 = fVar93;
  local_a80 = fVar89;
  fStack_a7c = fVar89;
  fStack_a78 = fVar89;
  fStack_a74 = fVar89;
  local_a70 = fVar85;
  fStack_a6c = fVar85;
  fStack_a68 = fVar85;
  fStack_a64 = fVar85;
  do {
    if (local_c28 == &local_800) {
LAB_015f425d:
      return local_c28 != &local_800;
    }
    local_c30 = local_c28 + -1;
    uVar26 = local_c28[-1];
    while ((uVar26 & 8) == 0) {
      uVar10 = uVar26 & 0xfffffffffffffff0;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar28._4_4_ = uVar2;
      auVar28._0_4_ = uVar2;
      auVar28._8_4_ = uVar2;
      auVar28._12_4_ = uVar2;
      auVar29 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar10 + 0x80 + uVar19),auVar28,
                                *(undefined1 (*) [16])(uVar10 + 0x20 + uVar19));
      auVar29 = vsubps_avx(auVar29,auVar71._0_16_);
      auVar36._0_4_ = fVar85 * auVar29._0_4_;
      auVar36._4_4_ = fVar87 * auVar29._4_4_;
      auVar36._8_4_ = fVar88 * auVar29._8_4_;
      auVar36._12_4_ = fVar104 * auVar29._12_4_;
      auVar29 = vmaxps_avx(auVar114._0_16_,auVar36);
      auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar10 + 0x80 + local_b38),auVar28,
                                *(undefined1 (*) [16])(uVar10 + 0x20 + local_b38));
      auVar36 = vsubps_avx(auVar36,auVar79._0_16_);
      auVar42._0_4_ = fVar89 * auVar36._0_4_;
      auVar42._4_4_ = fVar108 * auVar36._4_4_;
      auVar42._8_4_ = fVar110 * auVar36._8_4_;
      auVar42._12_4_ = fVar112 * auVar36._12_4_;
      auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar10 + 0x80 + uVar14),auVar28,
                                *(undefined1 (*) [16])(uVar10 + 0x20 + uVar14));
      auVar36 = vsubps_avx(auVar36,auVar84._0_16_);
      auVar52._0_4_ = fVar93 * auVar36._0_4_;
      auVar52._4_4_ = fVar113 * auVar36._4_4_;
      auVar52._8_4_ = fVar115 * auVar36._8_4_;
      auVar52._12_4_ = fVar116 * auVar36._12_4_;
      auVar36 = vmaxps_avx(auVar42,auVar52);
      auVar29 = vmaxps_avx(auVar29,auVar36);
      auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar10 + 0x80 + uVar27),auVar28,
                                *(undefined1 (*) [16])(uVar10 + 0x20 + uVar27));
      auVar36 = vsubps_avx(auVar36,auVar71._0_16_);
      auVar43._0_4_ = fVar94 * auVar36._0_4_;
      auVar43._4_4_ = fVar117 * auVar36._4_4_;
      auVar43._8_4_ = fVar96 * auVar36._8_4_;
      auVar43._12_4_ = fVar97 * auVar36._12_4_;
      auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar10 + 0x80 + uVar25),auVar28,
                                *(undefined1 (*) [16])(uVar10 + 0x20 + uVar25));
      auVar36 = vminps_avx(auVar119._0_16_,auVar43);
      auVar42 = vsubps_avx(auVar42,auVar79._0_16_);
      auVar53._0_4_ = fVar98 * auVar42._0_4_;
      auVar53._4_4_ = fVar100 * auVar42._4_4_;
      auVar53._8_4_ = fVar101 * auVar42._8_4_;
      auVar53._12_4_ = fVar102 * auVar42._12_4_;
      auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar10 + 0x80 + (uVar14 ^ 0x10)),auVar28,
                                *(undefined1 (*) [16])(uVar10 + 0x20 + (uVar14 ^ 0x10)));
      auVar42 = vsubps_avx(auVar42,auVar84._0_16_);
      auVar59._0_4_ = fVar103 * auVar42._0_4_;
      auVar59._4_4_ = fVar107 * auVar42._4_4_;
      auVar59._8_4_ = fVar109 * auVar42._8_4_;
      auVar59._12_4_ = fVar111 * auVar42._12_4_;
      auVar42 = vminps_avx(auVar53,auVar59);
      auVar36 = vminps_avx(auVar36,auVar42);
      if (((uint)uVar26 & 7) == 6) {
        auVar36 = vcmpps_avx(auVar29,auVar36,2);
        auVar29 = vcmpps_avx(*(undefined1 (*) [16])(uVar10 + 0xe0),auVar28,2);
        auVar42 = vcmpps_avx(auVar28,*(undefined1 (*) [16])(uVar10 + 0xf0),1);
        auVar29 = vandps_avx(auVar29,auVar42);
        auVar29 = vandps_avx(auVar29,auVar36);
      }
      else {
        auVar29 = vcmpps_avx(auVar29,auVar36,2);
      }
      auVar29 = vpslld_avx(auVar29,0x1f);
      uVar11 = vmovmskps_avx(auVar29);
      if (uVar11 == 0) goto LAB_015f4232;
      uVar11 = uVar11 & 0xff;
      lVar8 = 0;
      for (uVar26 = (ulong)uVar11; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
        lVar8 = lVar8 + 1;
      }
      uVar26 = *(ulong *)(uVar10 + lVar8 * 8);
      uVar11 = uVar11 - 1 & uVar11;
      uVar12 = (ulong)uVar11;
      if (uVar11 != 0) {
        do {
          *local_c30 = uVar26;
          local_c30 = local_c30 + 1;
          lVar8 = 0;
          for (uVar26 = uVar12; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
            lVar8 = lVar8 + 1;
          }
          uVar12 = uVar12 - 1 & uVar12;
          uVar26 = *(ulong *)(uVar10 + lVar8 * 8);
        } while (uVar12 != 0);
      }
    }
    local_b48 = (ulong)((uint)uVar26 & 0xf) - 8;
    uVar26 = uVar26 & 0xfffffffffffffff0;
    for (local_b50 = 0; local_b50 != local_b48; local_b50 = local_b50 + 1) {
      lVar16 = local_b50 * 0x50;
      local_b40 = context->scene;
      pGVar4 = (local_b40->geometries).items[*(uint *)(uVar26 + 0x30 + lVar16)].ptr;
      fVar94 = (pGVar4->time_range).lower;
      fVar94 = pGVar4->fnumTimeSegments *
               ((*(float *)(ray + k * 4 + 0xe0) - fVar94) / ((pGVar4->time_range).upper - fVar94));
      auVar29 = vroundss_avx(ZEXT416((uint)fVar94),ZEXT416((uint)fVar94),9);
      auVar29 = vminss_avx(auVar29,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
      auVar38 = vmaxss_avx(ZEXT816(0),auVar29);
      lVar13 = (long)(int)auVar38._0_4_ * 0x38;
      uVar17 = (ulong)*(uint *)(uVar26 + 4 + lVar16);
      lVar8 = *(long *)(*(long *)&pGVar4[2].numPrimitives + lVar13);
      lVar13 = *(long *)(*(long *)&pGVar4[2].numPrimitives + 0x38 + lVar13);
      auVar29 = *(undefined1 (*) [16])(lVar8 + (ulong)*(uint *)(uVar26 + lVar16) * 4);
      uVar12 = (ulong)*(uint *)(uVar26 + 0x10 + lVar16);
      auVar36 = *(undefined1 (*) [16])(lVar8 + uVar12 * 4);
      uVar20 = (ulong)*(uint *)(uVar26 + 0x20 + lVar16);
      auVar45 = *(undefined1 (*) [16])(lVar8 + uVar20 * 4);
      auVar42 = *(undefined1 (*) [16])(lVar8 + uVar17 * 4);
      uVar21 = (ulong)*(uint *)(uVar26 + 0x14 + lVar16);
      auVar28 = *(undefined1 (*) [16])(lVar8 + uVar21 * 4);
      uVar22 = (ulong)*(uint *)(uVar26 + 0x24 + lVar16);
      auVar46 = *(undefined1 (*) [16])(lVar8 + uVar22 * 4);
      uVar15 = (ulong)*(uint *)(uVar26 + 8 + lVar16);
      auVar43 = *(undefined1 (*) [16])(lVar8 + uVar15 * 4);
      uVar19 = (ulong)*(uint *)(uVar26 + 0x18 + lVar16);
      auVar52 = *(undefined1 (*) [16])(lVar8 + uVar19 * 4);
      uVar23 = (ulong)*(uint *)(uVar26 + 0x28 + lVar16);
      auVar53 = *(undefined1 (*) [16])(lVar8 + uVar23 * 4);
      uVar18 = (ulong)*(uint *)(uVar26 + 0xc + lVar16);
      auVar59 = *(undefined1 (*) [16])(lVar8 + uVar18 * 4);
      uVar24 = (ulong)*(uint *)(uVar26 + 0x1c + lVar16);
      auVar44 = *(undefined1 (*) [16])(lVar8 + uVar24 * 4);
      uVar10 = (ulong)*(uint *)(uVar26 + 0x2c + lVar16);
      auVar30 = *(undefined1 (*) [16])(lVar8 + uVar10 * 4);
      auVar31 = *(undefined1 (*) [16])(lVar13 + (ulong)*(uint *)(uVar26 + lVar16) * 4);
      auVar32 = *(undefined1 (*) [16])(lVar13 + uVar12 * 4);
      fVar94 = fVar94 - auVar38._0_4_;
      auVar38 = vunpcklps_avx(auVar29,auVar43);
      auVar43 = vunpckhps_avx(auVar29,auVar43);
      auVar37 = vunpcklps_avx(auVar42,auVar59);
      auVar42 = vunpckhps_avx(auVar42,auVar59);
      auVar29 = *(undefined1 (*) [16])(lVar13 + uVar17 * 4);
      auVar39 = vunpcklps_avx(auVar43,auVar42);
      auVar40 = vunpcklps_avx(auVar38,auVar37);
      auVar43 = vunpckhps_avx(auVar38,auVar37);
      auVar59 = vunpcklps_avx(auVar36,auVar52);
      auVar42 = vunpckhps_avx(auVar36,auVar52);
      auVar52 = vunpcklps_avx(auVar28,auVar44);
      auVar28 = vunpckhps_avx(auVar28,auVar44);
      auVar36 = *(undefined1 (*) [16])(lVar13 + uVar15 * 4);
      auVar44 = vunpcklps_avx(auVar42,auVar28);
      auVar38 = vunpcklps_avx(auVar59,auVar52);
      auVar28 = vunpckhps_avx(auVar59,auVar52);
      auVar59 = vunpcklps_avx(auVar45,auVar53);
      auVar52 = vunpckhps_avx(auVar45,auVar53);
      auVar37 = vunpcklps_avx(auVar46,auVar30);
      auVar53 = vunpckhps_avx(auVar46,auVar30);
      auVar42 = *(undefined1 (*) [16])(lVar13 + uVar18 * 4);
      auVar30 = vunpcklps_avx(auVar52,auVar53);
      auVar45 = vunpcklps_avx(auVar59,auVar37);
      auVar52 = vunpckhps_avx(auVar59,auVar37);
      auVar53 = vunpcklps_avx(auVar31,auVar36);
      auVar36 = vunpckhps_avx(auVar31,auVar36);
      auVar59 = vunpcklps_avx(auVar29,auVar42);
      auVar42 = vunpckhps_avx(auVar29,auVar42);
      auVar29 = *(undefined1 (*) [16])(lVar13 + uVar19 * 4);
      auVar31 = vunpcklps_avx(auVar36,auVar42);
      auVar37 = vunpcklps_avx(auVar53,auVar59);
      auVar42 = vunpckhps_avx(auVar53,auVar59);
      auVar59 = vunpcklps_avx(auVar32,auVar29);
      auVar53 = vunpckhps_avx(auVar32,auVar29);
      auVar29 = *(undefined1 (*) [16])(lVar13 + uVar21 * 4);
      auVar36 = *(undefined1 (*) [16])(lVar13 + uVar24 * 4);
      auVar32 = vunpcklps_avx(auVar29,auVar36);
      auVar29 = vunpckhps_avx(auVar29,auVar36);
      auVar46 = vunpcklps_avx(auVar53,auVar29);
      auVar47 = vunpcklps_avx(auVar59,auVar32);
      auVar53 = vunpckhps_avx(auVar59,auVar32);
      auVar29 = *(undefined1 (*) [16])(lVar13 + uVar20 * 4);
      auVar36 = *(undefined1 (*) [16])(lVar13 + uVar23 * 4);
      auVar32 = vunpcklps_avx(auVar29,auVar36);
      auVar59 = vunpckhps_avx(auVar29,auVar36);
      auVar29 = *(undefined1 (*) [16])(lVar13 + uVar22 * 4);
      auVar36 = *(undefined1 (*) [16])(lVar13 + uVar10 * 4);
      auVar54 = vunpcklps_avx(auVar29,auVar36);
      auVar29 = vunpckhps_avx(auVar29,auVar36);
      auVar36 = vunpcklps_avx(auVar59,auVar29);
      auVar59 = vunpcklps_avx(auVar32,auVar54);
      auVar29 = vunpckhps_avx(auVar32,auVar54);
      fVar98 = 1.0 - fVar94;
      auVar99._4_4_ = fVar98;
      auVar99._0_4_ = fVar98;
      auVar99._8_4_ = fVar98;
      auVar99._12_4_ = fVar98;
      auVar86._0_4_ = fVar94 * auVar37._0_4_;
      auVar86._4_4_ = fVar94 * auVar37._4_4_;
      auVar86._8_4_ = fVar94 * auVar37._8_4_;
      auVar86._12_4_ = fVar94 * auVar37._12_4_;
      auVar32 = vfmadd231ps_fma(auVar86,auVar99,auVar40);
      auVar72._0_4_ = fVar94 * auVar42._0_4_;
      auVar72._4_4_ = fVar94 * auVar42._4_4_;
      auVar72._8_4_ = fVar94 * auVar42._8_4_;
      auVar72._12_4_ = fVar94 * auVar42._12_4_;
      auVar43 = vfmadd231ps_fma(auVar72,auVar99,auVar43);
      auVar80._0_4_ = fVar94 * auVar31._0_4_;
      auVar80._4_4_ = fVar94 * auVar31._4_4_;
      auVar80._8_4_ = fVar94 * auVar31._8_4_;
      auVar80._12_4_ = fVar94 * auVar31._12_4_;
      auVar31 = vfmadd231ps_fma(auVar80,auVar99,auVar39);
      auVar90._0_4_ = fVar94 * auVar47._0_4_;
      auVar90._4_4_ = fVar94 * auVar47._4_4_;
      auVar90._8_4_ = fVar94 * auVar47._8_4_;
      auVar90._12_4_ = fVar94 * auVar47._12_4_;
      auVar38 = vfmadd231ps_fma(auVar90,auVar99,auVar38);
      auVar60._0_4_ = fVar94 * auVar53._0_4_;
      auVar60._4_4_ = fVar94 * auVar53._4_4_;
      auVar60._8_4_ = fVar94 * auVar53._8_4_;
      auVar60._12_4_ = fVar94 * auVar53._12_4_;
      auVar28 = vfmadd231ps_fma(auVar60,auVar99,auVar28);
      puVar1 = (undefined8 *)(uVar26 + 0x30 + lVar16);
      local_a00 = *puVar1;
      uStack_9f8 = puVar1[1];
      puVar1 = (undefined8 *)(uVar26 + 0x40 + lVar16);
      auVar37._0_4_ = fVar94 * auVar46._0_4_;
      auVar37._4_4_ = fVar94 * auVar46._4_4_;
      auVar37._8_4_ = fVar94 * auVar46._8_4_;
      auVar37._12_4_ = fVar94 * auVar46._12_4_;
      auVar53 = vfmadd231ps_fma(auVar37,auVar99,auVar44);
      auVar44._0_4_ = fVar94 * auVar59._0_4_;
      auVar44._4_4_ = fVar94 * auVar59._4_4_;
      auVar44._8_4_ = fVar94 * auVar59._8_4_;
      auVar44._12_4_ = fVar94 * auVar59._12_4_;
      auVar54._0_4_ = fVar94 * auVar29._0_4_;
      auVar54._4_4_ = fVar94 * auVar29._4_4_;
      auVar54._8_4_ = fVar94 * auVar29._8_4_;
      auVar54._12_4_ = fVar94 * auVar29._12_4_;
      auVar29._0_4_ = fVar94 * auVar36._0_4_;
      auVar29._4_4_ = fVar94 * auVar36._4_4_;
      auVar29._8_4_ = fVar94 * auVar36._8_4_;
      auVar29._12_4_ = fVar94 * auVar36._12_4_;
      auVar59 = vfmadd231ps_fma(auVar44,auVar99,auVar45);
      auVar52 = vfmadd231ps_fma(auVar54,auVar99,auVar52);
      auVar44 = vfmadd231ps_fma(auVar29,auVar99,auVar30);
      local_a10 = *puVar1;
      uStack_a08 = puVar1[1];
      uVar2 = *(undefined4 *)(local_bd8 + local_be0 * 4);
      auVar30._4_4_ = uVar2;
      auVar30._0_4_ = uVar2;
      auVar30._8_4_ = uVar2;
      auVar30._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(local_bd8 + local_be0 * 4 + 0x20);
      auVar95._4_4_ = uVar2;
      auVar95._0_4_ = uVar2;
      auVar95._8_4_ = uVar2;
      auVar95._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(local_bd8 + local_be0 * 4 + 0x40);
      auVar105._4_4_ = uVar2;
      auVar105._0_4_ = uVar2;
      auVar105._8_4_ = uVar2;
      auVar105._12_4_ = uVar2;
      auVar42 = vsubps_avx(auVar32,auVar30);
      local_c00 = vsubps_avx(auVar43,auVar95);
      local_ba0 = vsubps_avx(auVar31,auVar105);
      auVar29 = vsubps_avx(auVar38,auVar30);
      auVar36 = vsubps_avx(auVar28,auVar95);
      auVar28 = vsubps_avx(auVar53,auVar105);
      auVar43 = vsubps_avx(auVar59,auVar30);
      auVar52 = vsubps_avx(auVar52,auVar95);
      auVar53 = vsubps_avx(auVar44,auVar105);
      local_bb0 = vsubps_avx(auVar43,auVar42);
      auVar59 = vsubps_avx(auVar52,local_c00);
      local_bc0 = vsubps_avx(auVar53,local_ba0);
      auVar31._0_4_ = auVar42._0_4_ + auVar43._0_4_;
      auVar31._4_4_ = auVar42._4_4_ + auVar43._4_4_;
      auVar31._8_4_ = auVar42._8_4_ + auVar43._8_4_;
      auVar31._12_4_ = auVar42._12_4_ + auVar43._12_4_;
      auVar55._0_4_ = auVar52._0_4_ + local_c00._0_4_;
      auVar55._4_4_ = auVar52._4_4_ + local_c00._4_4_;
      auVar55._8_4_ = auVar52._8_4_ + local_c00._8_4_;
      auVar55._12_4_ = auVar52._12_4_ + local_c00._12_4_;
      fVar94 = local_ba0._0_4_;
      auVar61._0_4_ = auVar53._0_4_ + fVar94;
      fVar98 = local_ba0._4_4_;
      auVar61._4_4_ = auVar53._4_4_ + fVar98;
      fVar103 = local_ba0._8_4_;
      auVar61._8_4_ = auVar53._8_4_ + fVar103;
      fVar85 = local_ba0._12_4_;
      auVar61._12_4_ = auVar53._12_4_ + fVar85;
      auVar106._0_4_ = local_bc0._0_4_ * auVar55._0_4_;
      auVar106._4_4_ = local_bc0._4_4_ * auVar55._4_4_;
      auVar106._8_4_ = local_bc0._8_4_ * auVar55._8_4_;
      auVar106._12_4_ = local_bc0._12_4_ * auVar55._12_4_;
      auVar30 = vfmsub231ps_fma(auVar106,auVar59,auVar61);
      auVar62._0_4_ = local_bb0._0_4_ * auVar61._0_4_;
      auVar62._4_4_ = local_bb0._4_4_ * auVar61._4_4_;
      auVar62._8_4_ = local_bb0._8_4_ * auVar61._8_4_;
      auVar62._12_4_ = local_bb0._12_4_ * auVar61._12_4_;
      auVar44 = vfmsub231ps_fma(auVar62,local_bc0,auVar31);
      auVar32._0_4_ = auVar59._0_4_ * auVar31._0_4_;
      auVar32._4_4_ = auVar59._4_4_ * auVar31._4_4_;
      auVar32._8_4_ = auVar59._8_4_ * auVar31._8_4_;
      auVar32._12_4_ = auVar59._12_4_ * auVar31._12_4_;
      auVar31 = vfmsub231ps_fma(auVar32,local_bb0,auVar55);
      local_c20._4_4_ = *(float *)(local_bd8 + local_be0 * 4 + 0xc0);
      auVar56._0_4_ = local_c20._4_4_ * auVar31._0_4_;
      auVar56._4_4_ = local_c20._4_4_ * auVar31._4_4_;
      auVar56._8_4_ = local_c20._4_4_ * auVar31._8_4_;
      auVar56._12_4_ = local_c20._4_4_ * auVar31._12_4_;
      uVar2 = *(undefined4 *)(local_bd8 + local_be0 * 4 + 0xa0);
      auVar118._4_4_ = uVar2;
      auVar118._0_4_ = uVar2;
      auVar118._8_4_ = uVar2;
      auVar118._12_4_ = uVar2;
      auVar44 = vfmadd231ps_fma(auVar56,auVar118,auVar44);
      uVar2 = *(undefined4 *)(local_bd8 + local_be0 * 4 + 0x80);
      local_c10._4_4_ = uVar2;
      local_c10._0_4_ = uVar2;
      local_c10._8_4_ = uVar2;
      local_c10._12_4_ = uVar2;
      local_a20 = vfmadd231ps_fma(auVar44,local_c10,auVar30);
      local_b70 = vsubps_avx(local_c00,auVar36);
      local_b80 = vsubps_avx(local_ba0,auVar28);
      auVar38._0_4_ = local_c00._0_4_ + auVar36._0_4_;
      auVar38._4_4_ = local_c00._4_4_ + auVar36._4_4_;
      auVar38._8_4_ = local_c00._8_4_ + auVar36._8_4_;
      auVar38._12_4_ = local_c00._12_4_ + auVar36._12_4_;
      auVar63._0_4_ = auVar28._0_4_ + fVar94;
      auVar63._4_4_ = auVar28._4_4_ + fVar98;
      auVar63._8_4_ = auVar28._8_4_ + fVar103;
      auVar63._12_4_ = auVar28._12_4_ + fVar85;
      fVar89 = local_b80._0_4_;
      auVar73._0_4_ = auVar38._0_4_ * fVar89;
      fVar93 = local_b80._4_4_;
      auVar73._4_4_ = auVar38._4_4_ * fVar93;
      fVar87 = local_b80._8_4_;
      auVar73._8_4_ = auVar38._8_4_ * fVar87;
      fVar88 = local_b80._12_4_;
      auVar73._12_4_ = auVar38._12_4_ * fVar88;
      auVar30 = vfmsub231ps_fma(auVar73,local_b70,auVar63);
      local_b90 = vsubps_avx(auVar42,auVar29);
      fVar104 = local_b90._0_4_;
      auVar81._0_4_ = fVar104 * auVar63._0_4_;
      fVar108 = local_b90._4_4_;
      auVar81._4_4_ = fVar108 * auVar63._4_4_;
      fVar110 = local_b90._8_4_;
      auVar81._8_4_ = fVar110 * auVar63._8_4_;
      fVar112 = local_b90._12_4_;
      auVar81._12_4_ = fVar112 * auVar63._12_4_;
      auVar64._0_4_ = auVar42._0_4_ + auVar29._0_4_;
      auVar64._4_4_ = auVar42._4_4_ + auVar29._4_4_;
      auVar64._8_4_ = auVar42._8_4_ + auVar29._8_4_;
      auVar64._12_4_ = auVar42._12_4_ + auVar29._12_4_;
      auVar44 = vfmsub231ps_fma(auVar81,local_b80,auVar64);
      fVar113 = local_b70._0_4_;
      auVar65._0_4_ = fVar113 * auVar64._0_4_;
      fVar115 = local_b70._4_4_;
      auVar65._4_4_ = fVar115 * auVar64._4_4_;
      fVar116 = local_b70._8_4_;
      auVar65._8_4_ = fVar116 * auVar64._8_4_;
      fVar117 = local_b70._12_4_;
      auVar65._12_4_ = fVar117 * auVar64._12_4_;
      auVar31 = vfmsub231ps_fma(auVar65,local_b90,auVar38);
      auVar66._0_4_ = local_c20._4_4_ * auVar31._0_4_;
      auVar66._4_4_ = local_c20._4_4_ * auVar31._4_4_;
      auVar66._8_4_ = local_c20._4_4_ * auVar31._8_4_;
      auVar66._12_4_ = local_c20._4_4_ * auVar31._12_4_;
      auVar44 = vfmadd231ps_fma(auVar66,auVar118,auVar44);
      local_9e0 = vfmadd231ps_fma(auVar44,local_c10,auVar30);
      auVar44 = vsubps_avx(auVar29,auVar43);
      auVar45._0_4_ = auVar29._0_4_ + auVar43._0_4_;
      auVar45._4_4_ = auVar29._4_4_ + auVar43._4_4_;
      auVar45._8_4_ = auVar29._8_4_ + auVar43._8_4_;
      auVar45._12_4_ = auVar29._12_4_ + auVar43._12_4_;
      auVar43 = vsubps_avx(auVar36,auVar52);
      auVar39._0_4_ = auVar52._0_4_ + auVar36._0_4_;
      auVar39._4_4_ = auVar52._4_4_ + auVar36._4_4_;
      auVar39._8_4_ = auVar52._8_4_ + auVar36._8_4_;
      auVar39._12_4_ = auVar52._12_4_ + auVar36._12_4_;
      auVar52 = vsubps_avx(auVar28,auVar53);
      auVar67._0_4_ = auVar28._0_4_ + auVar53._0_4_;
      auVar67._4_4_ = auVar28._4_4_ + auVar53._4_4_;
      auVar67._8_4_ = auVar28._8_4_ + auVar53._8_4_;
      auVar67._12_4_ = auVar28._12_4_ + auVar53._12_4_;
      auVar74._0_4_ = auVar52._0_4_ * auVar39._0_4_;
      auVar74._4_4_ = auVar52._4_4_ * auVar39._4_4_;
      auVar74._8_4_ = auVar52._8_4_ * auVar39._8_4_;
      auVar74._12_4_ = auVar52._12_4_ * auVar39._12_4_;
      auVar36 = vfmsub231ps_fma(auVar74,auVar43,auVar67);
      auVar68._0_4_ = auVar67._0_4_ * auVar44._0_4_;
      auVar68._4_4_ = auVar67._4_4_ * auVar44._4_4_;
      auVar68._8_4_ = auVar67._8_4_ * auVar44._8_4_;
      auVar68._12_4_ = auVar67._12_4_ * auVar44._12_4_;
      auVar29 = vfmsub231ps_fma(auVar68,auVar52,auVar45);
      auVar46._0_4_ = auVar43._0_4_ * auVar45._0_4_;
      auVar46._4_4_ = auVar43._4_4_ * auVar45._4_4_;
      auVar46._8_4_ = auVar43._8_4_ * auVar45._8_4_;
      auVar46._12_4_ = auVar43._12_4_ * auVar45._12_4_;
      auVar28 = vfmsub231ps_fma(auVar46,auVar44,auVar39);
      local_c20._0_4_ = local_c20._4_4_;
      fStack_c18 = local_c20._4_4_;
      fStack_c14 = local_c20._4_4_;
      auVar47._0_4_ = local_c20._4_4_ * auVar28._0_4_;
      auVar47._4_4_ = local_c20._4_4_ * auVar28._4_4_;
      auVar47._8_4_ = local_c20._4_4_ * auVar28._8_4_;
      auVar47._12_4_ = local_c20._4_4_ * auVar28._12_4_;
      auVar29 = vfmadd231ps_fma(auVar47,auVar118,auVar29);
      auVar28 = vfmadd231ps_fma(auVar29,local_c10,auVar36);
      local_9f0 = local_a20._0_4_;
      fStack_9ec = local_a20._4_4_;
      fStack_9e8 = local_a20._8_4_;
      fStack_9e4 = local_a20._12_4_;
      local_9d0._0_4_ = auVar28._0_4_ + local_9f0 + local_9e0._0_4_;
      local_9d0._4_4_ = auVar28._4_4_ + fStack_9ec + local_9e0._4_4_;
      local_9d0._8_4_ = auVar28._8_4_ + fStack_9e8 + local_9e0._8_4_;
      local_9d0._12_4_ = auVar28._12_4_ + fStack_9e4 + local_9e0._12_4_;
      auVar40._8_4_ = 0x7fffffff;
      auVar40._0_8_ = 0x7fffffff7fffffff;
      auVar40._12_4_ = 0x7fffffff;
      auVar29 = vminps_avx(local_a20,local_9e0);
      auVar29 = vminps_avx(auVar29,auVar28);
      local_a30 = vandps_avx(local_9d0,auVar40);
      auVar82._0_4_ = local_a30._0_4_ * 1.1920929e-07;
      auVar82._4_4_ = local_a30._4_4_ * 1.1920929e-07;
      auVar82._8_4_ = local_a30._8_4_ * 1.1920929e-07;
      auVar82._12_4_ = local_a30._12_4_ * 1.1920929e-07;
      uVar19 = CONCAT44(auVar82._4_4_,auVar82._0_4_);
      auVar75._0_8_ = uVar19 ^ 0x8000000080000000;
      auVar75._8_4_ = -auVar82._8_4_;
      auVar75._12_4_ = -auVar82._12_4_;
      auVar29 = vcmpps_avx(auVar29,auVar75,5);
      auVar36 = vmaxps_avx(local_a20,local_9e0);
      auVar36 = vmaxps_avx(auVar36,auVar28);
      auVar36 = vcmpps_avx(auVar36,auVar82,2);
      local_bd0 = vorps_avx(auVar29,auVar36);
      k = local_be0;
      ray = local_bd8;
      if ((((local_bd0 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (local_bd0 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (local_bd0 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          local_bd0[0xf] < '\0') {
        auVar48._0_4_ = fVar113 * local_bc0._0_4_;
        auVar48._4_4_ = fVar115 * local_bc0._4_4_;
        auVar48._8_4_ = fVar116 * local_bc0._8_4_;
        auVar48._12_4_ = fVar117 * local_bc0._12_4_;
        auVar69._0_4_ = auVar59._0_4_ * fVar104;
        auVar69._4_4_ = auVar59._4_4_ * fVar108;
        auVar69._8_4_ = auVar59._8_4_ * fVar110;
        auVar69._12_4_ = auVar59._12_4_ * fVar112;
        auVar28 = vfmsub213ps_fma(auVar59,local_b80,auVar48);
        auVar76._0_4_ = auVar43._0_4_ * fVar89;
        auVar76._4_4_ = auVar43._4_4_ * fVar93;
        auVar76._8_4_ = auVar43._8_4_ * fVar87;
        auVar76._12_4_ = auVar43._12_4_ * fVar88;
        auVar83._0_4_ = auVar52._0_4_ * fVar104;
        auVar83._4_4_ = auVar52._4_4_ * fVar108;
        auVar83._8_4_ = auVar52._8_4_ * fVar110;
        auVar83._12_4_ = auVar52._12_4_ * fVar112;
        auVar52 = vfmsub213ps_fma(auVar52,local_b70,auVar76);
        auVar29 = vandps_avx(auVar48,auVar40);
        auVar36 = vandps_avx(auVar76,auVar40);
        auVar29 = vcmpps_avx(auVar29,auVar36,1);
        local_970 = vblendvps_avx(auVar52,auVar28,auVar29);
        auVar77._0_4_ = fVar113 * auVar44._0_4_;
        auVar77._4_4_ = fVar115 * auVar44._4_4_;
        auVar77._8_4_ = fVar116 * auVar44._8_4_;
        auVar77._12_4_ = fVar117 * auVar44._12_4_;
        auVar28 = vfmsub213ps_fma(auVar44,local_b80,auVar83);
        auVar49._0_4_ = local_bb0._0_4_ * fVar89;
        auVar49._4_4_ = local_bb0._4_4_ * fVar93;
        auVar49._8_4_ = local_bb0._8_4_ * fVar87;
        auVar49._12_4_ = local_bb0._12_4_ * fVar88;
        auVar52 = vfmsub213ps_fma(local_bc0,local_b90,auVar49);
        auVar29 = vandps_avx(auVar49,auVar40);
        auVar36 = vandps_avx(auVar83,auVar40);
        auVar29 = vcmpps_avx(auVar29,auVar36,1);
        local_960 = vblendvps_avx(auVar28,auVar52,auVar29);
        auVar28 = vfmsub213ps_fma(local_bb0,local_b70,auVar69);
        auVar43 = vfmsub213ps_fma(auVar43,local_b90,auVar77);
        auVar29 = vandps_avx(auVar69,auVar40);
        auVar36 = vandps_avx(auVar77,auVar40);
        auVar29 = vcmpps_avx(auVar29,auVar36,1);
        local_950 = vblendvps_avx(auVar43,auVar28,auVar29);
        auVar57._0_4_ = local_950._0_4_ * local_c20._4_4_;
        auVar57._4_4_ = local_950._4_4_ * local_c20._4_4_;
        auVar57._8_4_ = local_950._8_4_ * local_c20._4_4_;
        auVar57._12_4_ = local_950._12_4_ * local_c20._4_4_;
        auVar29 = vfmadd213ps_fma(auVar118,local_960,auVar57);
        auVar29 = vfmadd213ps_fma(local_c10,local_970,auVar29);
        auVar70._0_4_ = auVar29._0_4_ + auVar29._0_4_;
        auVar70._4_4_ = auVar29._4_4_ + auVar29._4_4_;
        auVar70._8_4_ = auVar29._8_4_ + auVar29._8_4_;
        auVar70._12_4_ = auVar29._12_4_ + auVar29._12_4_;
        auVar58._0_4_ = local_950._0_4_ * fVar94;
        auVar58._4_4_ = local_950._4_4_ * fVar98;
        auVar58._8_4_ = local_950._8_4_ * fVar103;
        auVar58._12_4_ = local_950._12_4_ * fVar85;
        auVar29 = vfmadd213ps_fma(local_c00,local_960,auVar58);
        auVar36 = vfmadd213ps_fma(auVar42,local_970,auVar29);
        auVar29 = vrcpps_avx(auVar70);
        auVar91._8_4_ = 0x3f800000;
        auVar91._0_8_ = 0x3f8000003f800000;
        auVar91._12_4_ = 0x3f800000;
        auVar42 = vfnmadd213ps_fma(auVar29,auVar70,auVar91);
        auVar29 = vfmadd132ps_fma(auVar42,auVar29,auVar29);
        local_980._0_4_ = (auVar36._0_4_ + auVar36._0_4_) * auVar29._0_4_;
        local_980._4_4_ = (auVar36._4_4_ + auVar36._4_4_) * auVar29._4_4_;
        local_980._8_4_ = (auVar36._8_4_ + auVar36._8_4_) * auVar29._8_4_;
        local_980._12_4_ = (auVar36._12_4_ + auVar36._12_4_) * auVar29._12_4_;
        uVar2 = *(undefined4 *)(local_bd8 + local_be0 * 4 + 0x60);
        auVar78._4_4_ = uVar2;
        auVar78._0_4_ = uVar2;
        auVar78._8_4_ = uVar2;
        auVar78._12_4_ = uVar2;
        auVar29 = vcmpps_avx(auVar78,local_980,2);
        uVar2 = *(undefined4 *)(local_bd8 + local_be0 * 4 + 0x100);
        auVar92._4_4_ = uVar2;
        auVar92._0_4_ = uVar2;
        auVar92._8_4_ = uVar2;
        auVar92._12_4_ = uVar2;
        auVar71 = ZEXT1664(auVar92);
        auVar36 = vcmpps_avx(local_980,auVar92,2);
        auVar29 = vandps_avx(auVar29,auVar36);
        auVar36 = local_bd0 & auVar29;
        if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar36 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar36 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar36[0xf] < '\0') {
          auVar29 = vandps_avx(auVar29,local_bd0);
          auVar36 = vcmpps_avx(auVar70,_DAT_01f45a50,4);
          local_9b0 = vandps_avx(auVar29,auVar36);
          uVar11 = vmovmskps_avx(local_9b0);
          if (uVar11 != 0) {
            local_9c0 = &local_c31;
            auVar29 = vrcpps_avx(local_9d0);
            auVar50._8_4_ = 0x3f800000;
            auVar50._0_8_ = 0x3f8000003f800000;
            auVar50._12_4_ = 0x3f800000;
            auVar36 = vfnmadd213ps_fma(local_9d0,auVar29,auVar50);
            auVar36 = vfmadd132ps_fma(auVar36,auVar29,auVar29);
            auVar41._8_4_ = 0x219392ef;
            auVar41._0_8_ = 0x219392ef219392ef;
            auVar41._12_4_ = 0x219392ef;
            auVar29 = vcmpps_avx(local_a30,auVar41,5);
            auVar29 = vandps_avx(auVar36,auVar29);
            auVar33._0_4_ = local_9f0 * auVar29._0_4_;
            auVar33._4_4_ = fStack_9ec * auVar29._4_4_;
            auVar33._8_4_ = fStack_9e8 * auVar29._8_4_;
            auVar33._12_4_ = fStack_9e4 * auVar29._12_4_;
            local_9a0 = vminps_avx(auVar33,auVar50);
            auVar34._0_4_ = auVar29._0_4_ * local_9e0._0_4_;
            auVar34._4_4_ = auVar29._4_4_ * local_9e0._4_4_;
            auVar34._8_4_ = auVar29._8_4_ * local_9e0._8_4_;
            auVar34._12_4_ = auVar29._12_4_ * local_9e0._12_4_;
            local_990 = vminps_avx(auVar34,auVar50);
            uVar19 = (ulong)(uVar11 & 0xff);
            do {
              uVar10 = 0;
              for (uVar12 = uVar19; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
                uVar10 = uVar10 + 1;
              }
              uVar11 = *(uint *)((long)&local_a00 + uVar10 * 4);
              pGVar4 = (local_b40->geometries).items[uVar11].ptr;
              local_c20 = (long)pGVar4;
              if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_c10._0_8_ = uVar10;
                  uVar10 = (ulong)(uint)((int)uVar10 * 4);
                  local_8c0 = *(undefined4 *)(local_9a0 + uVar10);
                  local_8a0 = *(undefined4 *)(local_990 + uVar10);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_980 + uVar10);
                  local_b30.context = context->user;
                  uVar2 = *(undefined4 *)((long)&local_a10 + uVar10);
                  local_880._4_4_ = uVar2;
                  local_880._0_4_ = uVar2;
                  local_880._8_4_ = uVar2;
                  local_880._12_4_ = uVar2;
                  local_880._16_4_ = uVar2;
                  local_880._20_4_ = uVar2;
                  local_880._24_4_ = uVar2;
                  local_880._28_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_970 + uVar10);
                  uVar3 = *(undefined4 *)(local_960 + uVar10);
                  local_900._4_4_ = uVar3;
                  local_900._0_4_ = uVar3;
                  local_900._8_4_ = uVar3;
                  local_900._12_4_ = uVar3;
                  local_900._16_4_ = uVar3;
                  local_900._20_4_ = uVar3;
                  local_900._24_4_ = uVar3;
                  local_900._28_4_ = uVar3;
                  uVar3 = *(undefined4 *)(local_950 + uVar10);
                  local_8e0._4_4_ = uVar3;
                  local_8e0._0_4_ = uVar3;
                  local_8e0._8_4_ = uVar3;
                  local_8e0._12_4_ = uVar3;
                  local_8e0._16_4_ = uVar3;
                  local_8e0._20_4_ = uVar3;
                  local_8e0._24_4_ = uVar3;
                  local_8e0._28_4_ = uVar3;
                  local_860._4_4_ = uVar11;
                  local_860._0_4_ = uVar11;
                  local_860._8_4_ = uVar11;
                  local_860._12_4_ = uVar11;
                  local_860._16_4_ = uVar11;
                  local_860._20_4_ = uVar11;
                  local_860._24_4_ = uVar11;
                  local_860._28_4_ = uVar11;
                  local_920[0] = (RTCHitN)(char)uVar2;
                  local_920[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_920[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_920[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_920[4] = (RTCHitN)(char)uVar2;
                  local_920[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_920[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_920[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_920[8] = (RTCHitN)(char)uVar2;
                  local_920[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_920[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_920[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_920[0xc] = (RTCHitN)(char)uVar2;
                  local_920[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_920[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_920[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_920[0x10] = (RTCHitN)(char)uVar2;
                  local_920[0x11] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_920[0x12] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_920[0x13] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_920[0x14] = (RTCHitN)(char)uVar2;
                  local_920[0x15] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_920[0x16] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_920[0x17] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_920[0x18] = (RTCHitN)(char)uVar2;
                  local_920[0x19] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_920[0x1a] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_920[0x1b] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_920[0x1c] = (RTCHitN)(char)uVar2;
                  local_920[0x1d] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_920[0x1e] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_920[0x1f] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  uStack_8bc = local_8c0;
                  uStack_8b8 = local_8c0;
                  uStack_8b4 = local_8c0;
                  uStack_8b0 = local_8c0;
                  uStack_8ac = local_8c0;
                  uStack_8a8 = local_8c0;
                  uStack_8a4 = local_8c0;
                  uStack_89c = local_8a0;
                  uStack_898 = local_8a0;
                  uStack_894 = local_8a0;
                  uStack_890 = local_8a0;
                  uStack_88c = local_8a0;
                  uStack_888 = local_8a0;
                  uStack_884 = local_8a0;
                  auVar35 = vpcmpeqd_avx2(local_860,local_860);
                  uStack_83c = (local_b30.context)->instID[0];
                  local_840 = uStack_83c;
                  uStack_838 = uStack_83c;
                  uStack_834 = uStack_83c;
                  uStack_830 = uStack_83c;
                  uStack_82c = uStack_83c;
                  uStack_828 = uStack_83c;
                  uStack_824 = uStack_83c;
                  uStack_81c = (local_b30.context)->instPrimID[0];
                  local_820 = uStack_81c;
                  uStack_818 = uStack_81c;
                  uStack_814 = uStack_81c;
                  uStack_810 = uStack_81c;
                  uStack_80c = uStack_81c;
                  uStack_808 = uStack_81c;
                  uStack_804 = uStack_81c;
                  local_b00 = local_940;
                  local_b30.valid = (int *)local_b00;
                  local_b30.geometryUserPtr = pGVar4->userPtr;
                  local_b30.hit = local_920;
                  local_b30.N = 8;
                  local_b30.ray = (RTCRayN *)ray;
                  if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    local_bf0 = auVar71._0_16_;
                    local_c00._0_8_ = uVar19;
                    auVar35 = ZEXT1632(auVar35._0_16_);
                    (*pGVar4->occlusionFilterN)(&local_b30);
                    auVar71 = ZEXT1664(local_bf0);
                    auVar35 = vpcmpeqd_avx2(auVar35,auVar35);
                    k = local_be0;
                    ray = local_bd8;
                    uVar19 = local_c00._0_8_;
                  }
                  auVar6 = vpcmpeqd_avx2(local_b00,_DAT_01f7b000);
                  auVar7 = auVar35 & ~auVar6;
                  if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar7 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar7 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar7 >> 0x7f,0) == '\0') &&
                        (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar7 >> 0xbf,0) == '\0') &&
                      (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar7[0x1f]) {
                    auVar6 = auVar6 ^ auVar35;
                  }
                  else {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(local_c20 + 0x3e) & 0x40) != 0)))) {
                      local_bf0 = auVar71._0_16_;
                      local_c00._0_8_ = uVar19;
                      auVar35 = ZEXT1632(auVar35._0_16_);
                      (*p_Var5)(&local_b30);
                      auVar71 = ZEXT1664(local_bf0);
                      auVar35 = vpcmpeqd_avx2(auVar35,auVar35);
                      k = local_be0;
                      ray = local_bd8;
                      uVar19 = local_c00._0_8_;
                    }
                    auVar7 = vpcmpeqd_avx2(local_b00,_DAT_01f7b000);
                    auVar6 = auVar7 ^ auVar35;
                    auVar51._8_4_ = 0xff800000;
                    auVar51._0_8_ = 0xff800000ff800000;
                    auVar51._12_4_ = 0xff800000;
                    auVar51._16_4_ = 0xff800000;
                    auVar51._20_4_ = 0xff800000;
                    auVar51._24_4_ = 0xff800000;
                    auVar51._28_4_ = 0xff800000;
                    auVar35 = vblendvps_avx(auVar51,*(undefined1 (*) [32])(local_b30.ray + 0x100),
                                            auVar7);
                    *(undefined1 (*) [32])(local_b30.ray + 0x100) = auVar35;
                  }
                  if ((((((((auVar6 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar6 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar6 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar6 >> 0x7f,0) == '\0') &&
                        (auVar6 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar6 >> 0xbf,0) == '\0') &&
                      (auVar6 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar6[0x1f]) {
                    *(int *)(ray + k * 4 + 0x100) = auVar71._0_4_;
                    uVar19 = uVar19 ^ 1L << (local_c10._0_8_ & 0x3f);
                    goto LAB_015f40f4;
                  }
                }
                *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                goto LAB_015f425d;
              }
              uVar19 = uVar19 ^ 1L << (uVar10 & 0x3f);
LAB_015f40f4:
            } while (uVar19 != 0);
          }
        }
      }
      auVar71 = ZEXT1664(local_a40);
      auVar79 = ZEXT1664(local_a50);
      auVar84 = ZEXT1664(local_a60);
      auVar114 = ZEXT1664(local_ad0);
      auVar119 = ZEXT1664(local_ae0);
      uVar19 = local_b58;
      fVar85 = local_a70;
      fVar87 = fStack_a6c;
      fVar88 = fStack_a68;
      fVar104 = fStack_a64;
      fVar89 = local_a80;
      fVar108 = fStack_a7c;
      fVar110 = fStack_a78;
      fVar112 = fStack_a74;
      fVar93 = local_a90;
      fVar113 = fStack_a8c;
      fVar115 = fStack_a88;
      fVar116 = fStack_a84;
      fVar94 = local_aa0;
      fVar117 = fStack_a9c;
      fVar96 = fStack_a98;
      fVar97 = fStack_a94;
      fVar98 = local_ab0;
      fVar100 = fStack_aac;
      fVar101 = fStack_aa8;
      fVar102 = fStack_aa4;
      fVar103 = local_ac0;
      fVar107 = fStack_abc;
      fVar109 = fStack_ab8;
      fVar111 = fStack_ab4;
    }
LAB_015f4232:
    local_c28 = local_c30;
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }